

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

int __thiscall
jsoncons::jsonpath::detail::
recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(recursive_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  supertype *psVar1;
  bool bVar2;
  undefined7 extraout_var;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar3;
  path_node_type *ppVar4;
  fd_set *__exceptfds_00;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
  *this_00;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *i;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var5;
  uint in_stack_00000008;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_60;
  basic_path_node<char> *local_58;
  object_range_type local_50;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
             *)CONCAT44(in_register_00000034,__nfds);
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds
                    );
  if (bVar2) {
    psVar1 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar1 == (supertype *)0x0) {
      (**(code **)(__timeout->tv_sec + 0x10))(__timeout,__writefds,__exceptfds);
    }
    else {
      (*psVar1->_vptr_jsonpath_selector[2])
                (psVar1,this_00,__readfds,__writefds,__exceptfds,__timeout,in_stack_00000008);
    }
    pkVar3 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds);
    if (pkVar3 != (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      i = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *)0x0;
      do {
        ppVar4 = (path_node_type *)__writefds;
        local_50.first_.it_._M_current = i;
        if ((in_stack_00000008 & 0xb) != 0) {
          local_70._M_len = (size_t)__writefds;
          ppVar4 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                             (this_00,(basic_path_node<char> **)&local_70,(unsigned_long *)&local_50
                             );
        }
        __exceptfds_00 =
             (fd_set *)
             basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        __exceptfds,(size_t)i);
        select(this,__nfds,__readfds,(fd_set *)ppVar4,__exceptfds_00,__timeout);
        i = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)((long)&(i->key_)._M_dataplus._M_p + 1);
        pkVar3 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               __exceptfds);
      } while (i < pkVar3);
    }
  }
  else {
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    pkVar3 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      psVar1 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar1 == (supertype *)0x0) {
        (**(code **)(__timeout->tv_sec + 0x10))(__timeout,__writefds,__exceptfds);
      }
      else {
        (*psVar1->_vptr_jsonpath_selector[2])
                  (psVar1,this_00,__readfds,__writefds,__exceptfds,__timeout,in_stack_00000008);
      }
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                (&local_50,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)__exceptfds);
      local_60 = local_50.last_.it_._M_current;
      _Var5._M_current = local_50.first_.it_._M_current;
      bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
      if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) != 0) {
        bVar2 = local_50.first_.it_._M_current == local_50.last_.it_._M_current;
      }
      while (pkVar3 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)(ulong)bVar2, bVar2 == false) {
        local_70._M_str = ((_Var5._M_current)->key_)._M_dataplus._M_p;
        local_70._M_len = ((_Var5._M_current)->key_)._M_string_length;
        ppVar4 = (path_node_type *)__writefds;
        if ((in_stack_00000008 & 0xb) != 0) {
          local_58 = (basic_path_node<char> *)__writefds;
          ppVar4 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,std::basic_string_view<char,std::char_traits<char>>const&>
                             (this_00,&local_58,&local_70);
        }
        select(this,__nfds,__readfds,(fd_set *)ppVar4,(fd_set *)&(_Var5._M_current)->value_,
               __timeout);
        _Var5._M_current = _Var5._M_current + 1;
        bVar2 = _Var5._M_current == local_60;
        if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) == 0) {
          bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
        }
      }
    }
  }
  return (int)pkVar3;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current,
            node_receiver_type& receiver,
            result_options options) const override
        {
            if (current.is_array())
            {
                this->tail_select(context, root, last, current, receiver, options);
                for (std::size_t i = 0; i < current.size(); ++i)
                {
                    select(context, root, 
                           path_generator_type::generate(context, last, i, options), current[i], receiver, options);
                }
            }
            else if (current.is_object())
            {
                this->tail_select(context, root, last, current, receiver, options);
                for (auto& item : current.object_range())
                {
                    select(context, root, 
                           path_generator_type::generate(context, last, item.key(), options), item.value(), receiver, options);
                }
            }
            //std::cout << "end wildcard_selector\n";
        }